

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int has_non_ASCII(char *_p)

{
  bool bVar1;
  byte *local_20;
  uchar *p;
  char *_p_local;
  
  local_20 = (byte *)_p;
  if (_p == (char *)0x0) {
    _p_local._4_4_ = 1;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (*local_20 != 0) {
        bVar1 = *local_20 < 0x80;
      }
      if (!bVar1) break;
      local_20 = local_20 + 1;
    }
    _p_local._4_4_ = (uint)(*local_20 != 0);
  }
  return _p_local._4_4_;
}

Assistant:

static int
has_non_ASCII(const char *_p)
{
	const unsigned char *p = (const unsigned char *)_p;

	if (p == NULL)
		return (1);
	while (*p != '\0' && *p < 128)
		p++;
	return (*p != '\0');
}